

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_XMLNode * __thiscall
ON_XMLNodePrivate::GetNodeAtPath(ON_XMLNodePrivate *this,wchar_t *wszPath,bool bCreate)

{
  int iVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  ON_XMLNode *pOVar4;
  undefined4 extraout_var;
  int local_4ac;
  ON_XMLNode *pChild;
  undefined1 local_488 [8];
  ChildIterator it;
  int pos;
  wchar_t *pstr;
  wchar_t *pNext;
  int i;
  int iLength;
  wchar_t wsz [261];
  int maxBuf;
  wchar_t *p;
  lock_guard<std::recursive_mutex> local_30;
  lock_guard<std::recursive_mutex> lg;
  bool bCreate_local;
  wchar_t *wszPath_local;
  ON_XMLNodePrivate *this_local;
  
  lg._M_device._7_1_ = bCreate;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_30,&this->m_mutex);
  pwVar3 = wszPath;
  if (wszPath == (wchar_t *)0x0) {
    this_local = (ON_XMLNodePrivate *)this->m_node;
  }
  else {
    while ((stack0xffffffffffffffc0 = pwVar3, *stack0xffffffffffffffc0 != L'\0' &&
           ((iVar1 = iswspace(*stack0xffffffffffffffc0), iVar1 != 0 ||
            (*stack0xffffffffffffffc0 == L'/'))))) {
      pwVar3 = stack0xffffffffffffffc0 + 1;
    }
    if (*stack0xffffffffffffffc0 == L'\0') {
      this_local = (ON_XMLNodePrivate *)this->m_node;
    }
    else {
      wsz[0x103] = L'Ą';
      wcsncpy(&i,stack0xffffffffffffffc0,0x104);
      wsz[0x102] = L'\0';
      sVar2 = wcslen(&i);
      pNext._0_4_ = (int)sVar2;
      while ((pNext._0_4_ = (int)pNext + -1, -1 < (int)pNext &&
             (iVar1 = iswspace((&i)[(int)pNext]), iVar1 != 0))) {
        (&i)[(int)pNext] = 0;
      }
      if (i == 0) {
        this_local = (ON_XMLNodePrivate *)this->m_node;
      }
      else {
        pstr = (wchar_t *)0x0;
        pwVar3 = wcschr(&i,L'/');
        if (pwVar3 == (wchar_t *)0x0) {
          local_4ac = -1;
        }
        else {
          local_4ac = (int)((long)pwVar3 - (long)&i >> 2);
        }
        it._private._4_4_ = local_4ac;
        if (local_4ac != -1) {
          pstr = wsz + (long)local_4ac + -1;
          (&i)[local_4ac] = 0;
        }
        (*this->m_node->_vptr_ON_XMLNode[0x2c])(local_488);
        do {
          pOVar4 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)local_488);
          if (pOVar4 == (ON_XMLNode *)0x0) {
            if ((lg._M_device._7_1_ & 1) == 0) {
              this_local = (ON_XMLNodePrivate *)0x0;
            }
            else {
              pOVar4 = (ON_XMLNode *)operator_new(0xe8);
              ON_XMLNode::ON_XMLNode(pOVar4,&i);
              pOVar4 = AttachChildNode(this,pOVar4);
              this_local = (ON_XMLNodePrivate *)
                           GetNodeAtPath(pOVar4->_private,pstr,(bool)(lg._M_device._7_1_ & 1));
            }
            goto LAB_009afe7c;
          }
          iVar1 = (*pOVar4->_vptr_ON_XMLNode[3])();
          pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar1))
          ;
          iVar1 = on_wcsicmp(&i,pwVar3);
        } while (iVar1 != 0);
        this_local = (ON_XMLNodePrivate *)
                     GetNodeAtPath(pOVar4->_private,pstr,(bool)(lg._M_device._7_1_ & 1));
LAB_009afe7c:
        ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)local_488);
      }
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_30);
  return (ON_XMLNode *)this_local;
}

Assistant:

ON_XMLNode* ON_XMLNodePrivate::GetNodeAtPath(const wchar_t* wszPath, bool bCreate)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  // Forward slash "/" is the separator.

  if (nullptr == wszPath)
    return &m_node;

  const wchar_t* p = wszPath;
  while (*p != 0)
  {
    if (!iswspace(*p) && *p != L'/')
      break;
    p++;
  }

  if (*p == 0)
    return &m_node; // The input string was empty.

  constexpr int maxBuf = 260;
  wchar_t wsz[maxBuf+1];
  wcsncpy(wsz, p, maxBuf);
  wsz[maxBuf] = 0;

  // Now right trim out the white space.
  const int iLength = (int)wcslen(wsz);

  for (int i = iLength - 1; i >= 0; i--)
  {
    if (iswspace(wsz[i]))
      wsz[i] = 0;
    else
      break;
  }

  // Check for a resultant empty string.
  if (*wsz == 0)
    return &m_node;

  const wchar_t* pNext = nullptr;
  const wchar_t* pstr = wcschr(wsz, L'/');

  const int pos = (pstr != nullptr) ? (int)(pstr - wsz) : -1;
  if (-1 != pos)
  {
    // sNext is the rest of the string that we're going to recurse through.
    pNext = wsz + pos + 1;
    wsz[pos] = 0;
  }

  auto it = m_node.GetChildIterator();
  ON_XMLNode* pChild = nullptr;
  while (nullptr != (pChild = it.GetNextChild()))
  {
    if (on_wcsicmp(wsz, pChild->TagName()) == 0)
    {
      return pChild->_private->GetNodeAtPath(pNext, bCreate);
    }
  }

  // The child was not found.
  if (bCreate)
  {
    return AttachChildNode(new ON_XMLNode(wsz))->_private->GetNodeAtPath(pNext, bCreate);
  }

  return nullptr;
}